

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O3

Vec_Ptr_t * Saig_ManGetRegistersToExclude(Aig_Man_t *p)

{
  ulong *puVar1;
  ulong uVar2;
  void *pvVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetMin.c"
                  ,0x1be,"Vec_Ptr_t *Saig_ManGetRegistersToExclude(Aig_Man_t *)");
  }
  iVar4 = 0;
  do {
    uVar7 = p->nTruePos + iVar4;
    if (((int)uVar7 < 0) || (p->vCos->nSize <= (int)uVar7)) goto LAB_006f8ae9;
    uVar15 = *(ulong *)((long)p->vCos->pArray[uVar7] + 8);
    puVar1 = (ulong *)((uVar15 & 0xfffffffffffffffe) + 0x18);
    *puVar1 = *puVar1 | (ulong)(((uint)uVar15 & 1) << 4) + 0x10;
    iVar4 = iVar4 + 1;
    uVar7 = p->nRegs;
    uVar15 = (ulong)uVar7;
  } while (iVar4 < (int)uVar7);
  if ((int)uVar7 < 1) {
    iVar4 = 0;
  }
  else {
    uVar10 = (ulong)(uint)p->nTruePos;
    iVar4 = 0;
    uVar9 = uVar15;
    do {
      if ((p->nTruePos < 0) || (p->vCos->nSize <= (int)uVar10)) goto LAB_006f8ae9;
      uVar2 = *(ulong *)((*(ulong *)((long)p->vCos->pArray[uVar10] + 8) & 0xfffffffffffffffe) + 0x18
                        );
      uVar11 = 0;
      if ((uVar2 & 0x10) != 0) {
        uVar11 = (uint)(uVar2 >> 5) & 1;
      }
      iVar4 = iVar4 + uVar11;
      uVar10 = uVar10 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  if (iVar4 != 0) {
    iVar13 = 0;
    if (0 < (int)uVar7) {
      uVar9 = 100;
      iVar14 = 0;
      do {
        uVar7 = p->nTruePos + iVar14;
        if (((int)uVar7 < 0) || (p->vCos->nSize <= (int)uVar7)) goto LAB_006f8ae9;
        pvVar3 = p->vCos->pArray[uVar7];
        if ((~*(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18) & 0x30) == 0) {
          iVar12 = (int)uVar9;
          if (iVar13 == iVar12) {
            if (iVar12 < 0x10) {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = 0x10;
              uVar9 = 0x10;
            }
            else {
              uVar9 = (ulong)(uint)(iVar12 * 2);
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(uVar9 * 8);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar5->pArray,uVar9 * 8);
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = iVar12 * 2;
            }
          }
          else {
            ppvVar6 = pVVar5->pArray;
          }
          lVar8 = (long)iVar13;
          iVar13 = iVar13 + 1;
          pVVar5->nSize = iVar13;
          ppvVar6[lVar8] = pvVar3;
          uVar15 = (ulong)(uint)p->nRegs;
        }
        iVar14 = iVar14 + 1;
        uVar7 = (uint)uVar15;
      } while (iVar14 < (int)uVar7);
    }
    if (iVar13 != iVar4) {
      __assert_fail("Vec_PtrSize(vNodes) == Diffs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetMin.c"
                    ,0x1d6,"Vec_Ptr_t *Saig_ManGetRegistersToExclude(Aig_Man_t *)");
    }
  }
  if (0 < (int)uVar7) {
    iVar4 = 0;
    do {
      uVar7 = p->nTruePos + iVar4;
      if (((int)uVar7 < 0) || (p->vCos->nSize <= (int)uVar7)) {
LAB_006f8ae9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (ulong *)((*(ulong *)((long)p->vCos->pArray[uVar7] + 8) & 0xfffffffffffffffe) + 0x18)
      ;
      *puVar1 = *puVar1 & 0xffffffffffffffcf;
      iVar4 = iVar4 + 1;
    } while (iVar4 < p->nRegs);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Saig_ManGetRegistersToExclude( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pFanin;
    int i, Diffs;
    assert( Saig_ManRegNum(p) > 0 );
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( !Aig_ObjFaninC0(pObj) )
            pFanin->fMarkA = 1;
        else
            pFanin->fMarkB = 1;
    }
    Diffs = 0;
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        Diffs += pFanin->fMarkA && pFanin->fMarkB;
    }
    vNodes = Vec_PtrAlloc( 100 );
    if ( Diffs > 0 )
    {
        Saig_ManForEachLi( p, pObj, i )
        {
            pFanin = Aig_ObjFanin0(pObj);
            if ( pFanin->fMarkA && pFanin->fMarkB )
                Vec_PtrPush( vNodes, pObj );
        }
        assert( Vec_PtrSize(vNodes) == Diffs );
    }
    Saig_ManForEachLi( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
    return vNodes;
}